

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int runQMake(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  iterator o;
  ulong uVar4;
  char *pcVar5;
  qsizetype qVar6;
  size_t __nbytes;
  PropertyPrinter *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  MetaMakefileGenerator *mkfile;
  int di;
  int exit_val;
  int ret;
  bool success;
  QString fn;
  Iterator pfile;
  QStringList files;
  QMakeParser parser;
  ProFileCache proFileCache;
  QMakeProperty prop;
  QString absoluteFilePath;
  QDir dir;
  QFileInfo fi;
  QString oldpwd;
  QMakeVfs vfs;
  QMakeProject project;
  QMakeGlobals globals;
  undefined4 in_stack_fffffffffffff6c8;
  CaseSensitivity in_stack_fffffffffffff6cc;
  QMakeProject *in_stack_fffffffffffff6d0;
  FILE *in_stack_fffffffffffff6d8;
  QMakeProject *in_stack_fffffffffffff6e0;
  FILE *in_stack_fffffffffffff6e8;
  FILE *in_stack_fffffffffffff6f0;
  undefined7 in_stack_fffffffffffff6f8;
  byte in_stack_fffffffffffff6ff;
  FILE *in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  QMAKE_MODE QVar7;
  undefined1 in_stack_fffffffffffff70c;
  byte in_stack_fffffffffffff70d;
  byte bVar8;
  byte bVar9;
  int local_8d0;
  int local_8c8;
  undefined4 in_stack_fffffffffffff74c;
  QMakeProperty *in_stack_fffffffffffff750;
  undefined1 local_860 [52];
  uint local_82c;
  undefined1 local_7f8 [96];
  undefined1 local_798 [53];
  QLatin1Char local_763 [3];
  undefined1 local_760 [48];
  undefined1 local_730 [48];
  QString local_700;
  iterator local_6e8 [4];
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  QMakeParser local_6b0;
  ProFileCache local_640 [5];
  QMakeProperty local_618;
  undefined1 local_608 [48];
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined1 local_590 [24];
  undefined1 local_578 [24];
  CaseSensitivity local_560;
  undefined1 local_550 [48];
  undefined1 local_520 [24];
  undefined8 local_508;
  undefined8 local_500;
  char *local_4f8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  QMakeVfs local_4a1;
  QMakeProject local_4a0;
  QMakeGlobals local_1c0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  setvbuf(_stdout,(char *)0x0,2,0);
  if ((((int)in_EDI < 4) ||
      (iVar2 = strcmp(*(char **)((long)&(in_RSI->super__Function_base)._M_functor + 8),"-qtconf"),
      iVar2 != 0)) || (iVar2 = strcmp((char *)in_RSI->_M_invoker,"-install"), iVar2 != 0)) {
    if (((int)in_EDI < 2) ||
       (iVar2 = strcmp(*(char **)((long)&(in_RSI->super__Function_base)._M_functor + 8),"-install"),
       iVar2 != 0)) {
      local_4a1 = (QMakeVfs)0xaa;
      QMakeVfs::QMakeVfs((QMakeVfs *)0x31f7bc);
      Option::vfs = &local_4a1;
      memset(&local_1c0,0xaa,0x1b8);
      QMakeGlobals::QMakeGlobals((QMakeGlobals *)in_stack_fffffffffffff6e0);
      Option::globals = &local_1c0;
      uVar3 = Option::init((Option *)(ulong)in_EDI,(EVP_PKEY_CTX *)in_RSI);
      if (uVar3 == 0) {
        local_4c0 = 0xaaaaaaaaaaaaaaaa;
        local_4b8 = 0xaaaaaaaaaaaaaaaa;
        local_4b0 = 0xaaaaaaaaaaaaaaaa;
        qmake_getpwd();
        QString::operator=(&Option::output_dir,(QString *)&local_4c0);
        QFile::fileName();
        bVar1 = QString::isEmpty((QString *)0x31f8cb);
        bVar8 = 0;
        bVar9 = bVar8;
        if (!bVar1) {
          QFile::fileName();
          local_4f8 = "-";
          bVar8 = operator!=((QString *)in_stack_fffffffffffff6d0,
                             (char **)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
          ;
          bVar9 = bVar8;
          QString::~QString((QString *)0x31f93c);
        }
        QString::~QString((QString *)0x31f949);
        if ((bVar8 & 1) != 0) {
          local_500 = 0xaaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_500,(QFileDevice *)Option::output);
          local_508 = 0xaaaaaaaaaaaaaaaa;
          uVar4 = QFileInfo::isDir();
          if ((uVar4 & 1) == 0) {
            QFileInfo::absolutePath();
          }
          else {
            QFileInfo::absoluteFilePath();
          }
          QDir::cleanPath((QString *)local_520);
          QDir::QDir((QDir *)&local_508,(QString *)local_520);
          QString::~QString((QString *)0x31f9fe);
          QString::~QString((QString *)0x31fa0b);
          QDir::dirName();
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8);
          in_stack_fffffffffffff70d = QString::endsWith((QLatin1String *)local_550,local_560);
          QString::~QString((QString *)0x31fa67);
          if ((in_stack_fffffffffffff70d & 1) != 0) {
            QString::QString((QString *)in_stack_fffffffffffff6d8,
                             (char *)CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(
                                                  in_stack_fffffffffffff70d,
                                                  CONCAT14(in_stack_fffffffffffff70c,
                                                           in_stack_fffffffffffff708)))));
            QDir::filePath((QString *)local_590);
            QDir::cleanPath((QString *)local_578);
            QDir::setPath((QString *)&local_508);
            QString::~QString((QString *)0x31fadc);
            QString::~QString((QString *)0x31fae9);
            QString::~QString((QString *)0x31faf6);
          }
          QDir::path();
          QString::operator=((QString *)in_stack_fffffffffffff6d0,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
          QString::~QString((QString *)0x31fb2c);
          local_5d8 = 0xaaaaaaaaaaaaaaaa;
          local_5d0 = 0xaaaaaaaaaaaaaaaa;
          local_5c8 = 0xaaaaaaaaaaaaaaaa;
          QFileInfo::absoluteFilePath();
          QDir::cleanPath((QString *)&local_5d8);
          QString::~QString((QString *)0x31fb90);
          QString::size(&Option::output_dir);
          QString::mid((longlong)local_608,(longlong)&local_5d8);
          QFile::setFileName((QString *)Option::output);
          QString::~QString((QString *)0x31fbe0);
          QString::~QString((QString *)0x31fbed);
          QDir::~QDir((QDir *)&local_508);
          QFileInfo::~QFileInfo((QFileInfo *)&local_500);
        }
        local_618.settings = (QSettings *)0xaaaaaaaaaaaaaaaa;
        local_618.m_values.d = (Data *)0xaaaaaaaaaaaaaaaa;
        QMakeProperty::QMakeProperty((QMakeProperty *)in_stack_fffffffffffff6d0);
        if (Option::qmake_mode == QMAKE_SET_PROPERTY) {
          local_8d0 = QMakeProperty::setProperty
                                ((QMakeProperty *)in_stack_fffffffffffff6f0,
                                 (QStringList *)in_stack_fffffffffffff6e8);
        }
        else if (Option::qmake_mode == QMAKE_UNSET_PROPERTY) {
          QMakeProperty::unsetProperty
                    ((QMakeProperty *)in_stack_fffffffffffff6e0,
                     (QStringList *)in_stack_fffffffffffff6d8);
          local_8d0 = 0;
        }
        else if (Option::qmake_mode == QMAKE_QUERY_PROPERTY) {
          std::function<void(QList<std::pair<QString,QString>>const&)>::
          function<void(&)(QList<std::pair<QString,QString>>const&),void>
                    ((function<void_(const_QList<std::pair<QString,_QString>_>_&)> *)
                     in_stack_fffffffffffff6d0,
                     (_func_void_QList<std::pair<QString,_QString>_>_ptr *)
                     CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
          local_8d0 = QMakeProperty::queryProperty
                                (in_stack_fffffffffffff750,
                                 (QStringList *)CONCAT44(in_stack_fffffffffffff74c,in_EDI),in_RSI);
          std::function<void_(const_QList<std::pair<QString,_QString>_>_&)>::~function
                    ((function<void_(const_QList<std::pair<QString,_QString>_>_&)> *)0x31fc99);
        }
        else {
          QVar7 = Option::qmake_mode;
          QMakeGlobals::setQMakeProperty(&local_1c0,&local_618);
          local_640[0].parsed_files.d = (QHash<int,_ProFileCache::Entry>)(Data *)0xaaaaaaaaaaaaaaaa;
          ProFileCache::ProFileCache((ProFileCache *)0x31fd2d);
          Option::proFileCache = local_640;
          memset(&local_6b0,0xaa,0x70);
          QMakeParser::QMakeParser
                    ((QMakeParser *)in_stack_fffffffffffff6e0,
                     (ProFileCache *)in_stack_fffffffffffff6d8,(QMakeVfs *)in_stack_fffffffffffff6d0
                     ,(QMakeParserHandler *)
                      CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
          Option::parser = &local_6b0;
          memset(&local_4a0,0xaa,0x2e0);
          QMakeProject::QMakeProject(in_stack_fffffffffffff6d0);
          local_8d0 = 0;
          local_6c8 = 0xaaaaaaaaaaaaaaaa;
          local_6c0 = 0xaaaaaaaaaaaaaaaa;
          local_6b8 = 0xaaaaaaaaaaaaaaaa;
          QList<QString>::QList((QList<QString> *)0x31fdf2);
          if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
            QString::QString((QString *)in_stack_fffffffffffff6d8,
                             (char *)CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(
                                                  in_stack_fffffffffffff70d,
                                                  CONCAT14(in_stack_fffffffffffff70c,QVar7)))));
            QList<QString>::operator<<
                      ((QList<QString> *)in_stack_fffffffffffff6d0,
                       (rvalue_ref)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
            QString::~QString((QString *)0x31fe34);
          }
          else {
            QList<QString>::operator=
                      ((QList<QString> *)in_stack_fffffffffffff6d0,
                       (QList<QString> *)
                       CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
          }
          local_6e8[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
          local_6e8[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff6d0);
          while( true ) {
            o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff6d0);
            bVar1 = QList<QString>::iterator::operator!=(local_6e8,o);
            if (!bVar1) break;
            if ((Option::qmake_mode == QMAKE_GENERATE_MAKEFILE) ||
               (Option::qmake_mode == QMAKE_GENERATE_PRL)) {
              local_700.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_700.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_700.d.size = -0x5555555555555556;
              QList<QString>::iterator::operator*(local_6e8);
              __nbytes = 1;
              Option::normalizePath
                        ((QString *)in_stack_fffffffffffff6e8,
                         SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x30,0));
              uVar4 = QFile::exists((QString *)&local_700);
              if ((uVar4 & 1) == 0) {
                in_stack_fffffffffffff700 = _stderr;
                QDir::toNativeSeparators((QString *)local_730);
                QString::toLatin1((QString *)
                                  CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                pcVar5 = QByteArray::constData((QByteArray *)0x31ff63);
                fprintf(in_stack_fffffffffffff700,"Cannot find file: %s.\n",pcVar5);
                QByteArray::~QByteArray((QByteArray *)0x31ff86);
                QString::~QString((QString *)0x31ff93);
                local_8d0 = 2;
                local_8c8 = 5;
              }
              else {
                if (Option::debug_level != 0) {
                  QDir::toNativeSeparators((QString *)local_760);
                  QString::toLatin1((QString *)
                                    CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                  pcVar5 = QByteArray::constData((QByteArray *)0x31ffeb);
                  debug_msg_internal(1,"Resetting dir to: %s",pcVar5);
                  QByteArray::~QByteArray((QByteArray *)0x32000e);
                  QString::~QString((QString *)0x32001b);
                }
                qmake_setpwd((QString *)
                             CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                QLatin1Char::QLatin1Char(local_763,'/');
                QChar::QChar<QLatin1Char,_true>
                          ((QChar *)in_stack_fffffffffffff6d0,
                           (QLatin1Char)(char)((ulong)in_stack_fffffffffffff6d8 >> 0x38));
                qVar6 = QString::lastIndexOf
                                  ((QString *)in_stack_fffffffffffff6d0,
                                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff6d8 >> 0x30),
                                   in_stack_fffffffffffff6cc);
                if ((int)qVar6 != -1) {
                  if (Option::debug_level != 0) {
                    QString::left((QString *)in_stack_fffffffffffff6e8,
                                  (qsizetype)in_stack_fffffffffffff6e0);
                    QDir::toNativeSeparators((QString *)local_798);
                    QString::toLatin1((QString *)
                                      CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
                    ;
                    pcVar5 = QByteArray::constData((QByteArray *)0x3200d9);
                    debug_msg_internal(1,"Changing dir to: %s",pcVar5);
                    QByteArray::~QByteArray((QByteArray *)0x3200fc);
                    QString::~QString((QString *)0x320109);
                    QString::~QString((QString *)0x320116);
                  }
                  QString::left((QString *)in_stack_fffffffffffff6e8,
                                (qsizetype)in_stack_fffffffffffff6e0);
                  bVar1 = qmake_setpwd((QString *)
                                       CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8)
                                      );
                  in_stack_fffffffffffff6ff = bVar1 ^ 0xff;
                  QString::~QString((QString *)0x320150);
                  if ((in_stack_fffffffffffff6ff & 1) != 0) {
                    in_stack_fffffffffffff6f0 = _stderr;
                    QString::left((QString *)in_stack_fffffffffffff6e8,
                                  (qsizetype)in_stack_fffffffffffff6e0);
                    QDir::toNativeSeparators((QString *)local_7f8);
                    QString::toLatin1((QString *)
                                      CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))
                    ;
                    pcVar5 = QByteArray::constData((QByteArray *)0x3201bd);
                    fprintf(in_stack_fffffffffffff6f0,"Cannot find directory: %s\n",pcVar5);
                    QByteArray::~QByteArray((QByteArray *)0x3201e0);
                    QString::~QString((QString *)0x3201ed);
                    QString::~QString((QString *)0x3201fa);
                  }
                  QString::size(&local_700);
                  QString::right((QString *)in_stack_fffffffffffff6e8,
                                 (qsizetype)in_stack_fffffffffffff6e0);
                  QString::operator=((QString *)in_stack_fffffffffffff6d0,
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                  QString::~QString((QString *)0x32024d);
                }
                Option::prepareProject((QString *)in_stack_fffffffffffff6e0);
                QFlags<QMakeEvaluator::LoadFlag>::QFlags
                          ((QFlags<QMakeEvaluator::LoadFlag> *)in_stack_fffffffffffff6d0,
                           in_stack_fffffffffffff6cc);
                uVar4 = QMakeProject::read(&local_4a0,(int)&local_700,(void *)(ulong)local_82c,
                                           __nbytes);
                if ((uVar4 & 1) == 0) {
                  in_stack_fffffffffffff6e8 = _stderr;
                  QList<QString>::iterator::operator*(local_6e8);
                  QDir::toNativeSeparators((QString *)local_860);
                  QString::toLatin1((QString *)
                                    CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                  pcVar5 = QByteArray::constData((QByteArray *)0x3202de);
                  fprintf(in_stack_fffffffffffff6e8,"Error processing project file: %s\n",pcVar5);
                  QByteArray::~QByteArray((QByteArray *)0x320301);
                  QString::~QString((QString *)0x32030e);
                  local_8d0 = 3;
                  local_8c8 = 5;
                }
                else if ((Option::mkfile::do_preprocess & 1U) == 0) {
                  local_8c8 = 0;
                }
                else {
                  QMakeProject::dump((QMakeProject *)
                                     CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8));
                  local_8c8 = 5;
                }
              }
              QString::~QString((QString *)0x320358);
              if (local_8c8 == 0) goto LAB_00320369;
            }
            else {
LAB_00320369:
              QString::QString((QString *)0x32037e);
              in_stack_fffffffffffff6d0 =
                   (QMakeProject *)
                   MetaMakefileGenerator::createMetaGenerator
                             ((QMakeProject *)
                              CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(in_stack_fffffffffffff70d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffff70c,QVar7)))),
                              (QString *)in_stack_fffffffffffff700,(bool)in_stack_fffffffffffff6ff,
                              (bool *)in_stack_fffffffffffff6f0);
              QString::~QString((QString *)0x3203af);
              in_stack_fffffffffffff6e0 = in_stack_fffffffffffff6d0;
              if ((in_stack_fffffffffffff6d0 != (QMakeProject *)0x0) &&
                 (uVar3 = (*(code *)(((in_stack_fffffffffffff6d0->super_QMakeEvaluator).m_caller)->
                                    m_locationStack).super_QList<QMakeEvaluator::Location>.d.d)(),
                 (uVar3 & 1) == 0)) {
                if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
                  fprintf(_stderr,"Unable to generate project file.\n");
                }
                else {
                  in_stack_fffffffffffff6d8 = _stderr;
                  QList<QString>::iterator::operator*(local_6e8);
                  QDir::toNativeSeparators((QString *)&stack0xfffffffffffff750);
                  QString::toLatin1((QString *)
                                    CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
                  pcVar5 = QByteArray::constData((QByteArray *)0x32045e);
                  fprintf(in_stack_fffffffffffff6d8,"Unable to generate makefile for: %s\n",pcVar5);
                  QByteArray::~QByteArray((QByteArray *)0x320481);
                  QString::~QString((QString *)0x32048e);
                }
                local_8d0 = 5;
              }
              if (in_stack_fffffffffffff6d0 != (QMakeProject *)0x0) {
                (**(code **)&((in_stack_fffffffffffff6d0->super_QMakeEvaluator).m_caller)->
                             m_debugLevel)();
              }
            }
            QList<QString>::iterator::operator++
                      ((iterator *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc);
          }
          qmakeClearCaches();
          QList<QString>::~QList((QList<QString> *)0x3204f8);
          QMakeProject::~QMakeProject(in_stack_fffffffffffff6d0);
          QMakeParser::~QMakeParser((QMakeParser *)in_stack_fffffffffffff6d0);
          ProFileCache::~ProFileCache((ProFileCache *)in_stack_fffffffffffff6d8);
        }
        QMakeProperty::~QMakeProperty((QMakeProperty *)in_stack_fffffffffffff6d0);
        QString::~QString((QString *)0x320539);
      }
      else if ((uVar3 & 4) == 0) {
        local_8d0 = 0;
      }
      else {
        local_8d0 = 1;
      }
      QMakeGlobals::~QMakeGlobals((QMakeGlobals *)in_stack_fffffffffffff6e0);
      QMakeVfs::~QMakeVfs((QMakeVfs *)0x320553);
    }
    else {
      local_8d0 = doInstall((int)in_stack_fffffffffffff6d0,
                            (char **)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
    }
  }
  else {
    local_8d0 = doInstall((int)in_stack_fffffffffffff6d0,
                          (char **)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_8d0;
  }
  __stack_chk_fail();
}

Assistant:

int runQMake(int argc, char **argv)
{
    QHashSeed::setDeterministicGlobalSeed();

    // stderr is unbuffered by default, but stdout buffering depends on whether
    // there is a terminal attached. Buffering can make output from stderr and stdout
    // appear out of sync, so force stdout to be unbuffered as well.
    // This is particularly important for things like QtCreator and scripted builds.
    setvbuf(stdout, (char *)NULL, _IONBF, 0);

    // Workaround for inferior/missing command line tools on Windows: make our own!
    if (argc >= 4 && !strcmp(argv[1], "-qtconf") && !strcmp(argv[3], "-install"))
        return doInstall(argc - 4, argv + 4);
    if (argc >= 2 && !strcmp(argv[1], "-install"))
        return doInstall(argc - 2, argv + 2);

#ifdef Q_OS_WIN
    {
        // Support running as Visual C++'s compiler
        const wchar_t *cmdline = _wgetenv(L"MSC_CMD_FLAGS");
        if (!cmdline || !*cmdline)
            cmdline = _wgetenv(L"MSC_IDE_FLAGS");
        if (cmdline && *cmdline)
            return dumpMacros(cmdline);
    }
#endif

    QMakeVfs vfs;
    Option::vfs = &vfs;
    QMakeGlobals globals;
    Option::globals = &globals;

    // parse command line
    int ret = Option::init(argc, argv);
    if(ret != Option::QMAKE_CMDLINE_SUCCESS) {
        if ((ret & Option::QMAKE_CMDLINE_ERROR) != 0)
            return 1;
        return 0;
    }

    QString oldpwd = qmake_getpwd();

    Option::output_dir = oldpwd; //for now this is the output dir
    if (!Option::output.fileName().isEmpty() && Option::output.fileName() != "-") {
        // The output 'filename', as given by the -o option, might include one
        // or more directories, so we may need to rebase the output directory.
        QFileInfo fi(Option::output);

        QDir dir(QDir::cleanPath(fi.isDir() ? fi.absoluteFilePath() : fi.absolutePath()));

        // Don't treat Xcode project directory as part of OUT_PWD
        if (dir.dirName().endsWith(QLatin1String(".xcodeproj"))) {
            // Note: we're intentionally not using cdUp(), as the dir may not exist
            dir.setPath(QDir::cleanPath(dir.filePath("..")));
        }

        Option::output_dir = dir.path();
        QString absoluteFilePath = QDir::cleanPath(fi.absoluteFilePath());
        Option::output.setFileName(absoluteFilePath.mid(Option::output_dir.size() + 1));
    }

    QMakeProperty prop;
    switch (Option::qmake_mode) {
    case Option::QMAKE_QUERY_PROPERTY:
        return prop.queryProperty(Option::prop::properties);
    case Option::QMAKE_SET_PROPERTY:
        return prop.setProperty(Option::prop::properties);
    case Option::QMAKE_UNSET_PROPERTY:
        prop.unsetProperty(Option::prop::properties);
        return 0;
    default:
        break;
    }

    globals.setQMakeProperty(&prop);

    ProFileCache proFileCache;
    Option::proFileCache = &proFileCache;
    QMakeParser parser(&proFileCache, &vfs, &Option::evalHandler);
    Option::parser = &parser;

    QMakeProject project;
    int exit_val = 0;
    QStringList files;
    if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
        files << "(*hack*)"; //we don't even use files, but we do the for() body once
    else
        files = Option::mkfile::project_files;
    for(QStringList::Iterator pfile = files.begin(); pfile != files.end(); pfile++) {
        if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
           Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
            QString fn = Option::normalizePath(*pfile);
            if(!QFile::exists(fn)) {
                fprintf(stderr, "Cannot find file: %s.\n",
                        QDir::toNativeSeparators(fn).toLatin1().constData());
                exit_val = 2;
                continue;
            }

            //setup pwd properly
            debug_msg(1, "Resetting dir to: %s",
                      QDir::toNativeSeparators(oldpwd).toLatin1().constData());
            qmake_setpwd(oldpwd); //reset the old pwd
            int di = fn.lastIndexOf(QLatin1Char('/'));
            if(di != -1) {
                debug_msg(1, "Changing dir to: %s",
                          QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                if(!qmake_setpwd(fn.left(di)))
                    fprintf(stderr, "Cannot find directory: %s\n",
                            QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                fn = fn.right(fn.size() - di - 1);
            }

            Option::prepareProject(fn);

            // read project..
            if(!project.read(fn)) {
                fprintf(stderr, "Error processing project file: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
                exit_val = 3;
                continue;
            }
            if (Option::mkfile::do_preprocess) {
                project.dump();
                continue; //no need to create makefile
            }
        }

        bool success = true;
        MetaMakefileGenerator *mkfile = MetaMakefileGenerator::createMetaGenerator(&project, QString(), false, &success);
        if (!success)
            exit_val = 3;

        if (mkfile && !mkfile->write()) {
            if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
                fprintf(stderr, "Unable to generate project file.\n");
            else
                fprintf(stderr, "Unable to generate makefile for: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
            exit_val = 5;
        }
        delete mkfile;
        mkfile = nullptr;
    }
    qmakeClearCaches();
    return exit_val;
}